

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-test.cc
# Opt level: O1

void __thiscall
FileTest_MoveFromTemporaryInAssignmentClosesFile_Test::TestBody
          (FileTest_MoveFromTemporaryInAssignmentClosesFile_Test *this)

{
  file fd;
  bool bVar1;
  int in_ESI;
  char *in_R9;
  file f;
  AssertionResult gtest_ar_;
  file f_1;
  file local_4c;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  string local_28;
  
  open_file();
  fd.fd_ = local_4c.fd_;
  open_file();
  fmt::v5::file::close(&local_4c,in_ESI);
  local_4c.fd_ = (int)local_28._M_dataplus._M_p;
  local_28._M_dataplus._M_p._0_4_ = 0xffffffff;
  fmt::v5::file::~file((file *)&local_28);
  local_38[0] = (internal)isclosed(fd.fd_);
  local_30.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_38[0]) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_28,local_38,(AssertionResult *)"isclosed(old_fd)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/posix-test.cc"
               ,0xec,(char *)CONCAT44(local_28._M_dataplus._M_p._4_4_,(int)local_28._M_dataplus._M_p
                                     ));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_28._M_dataplus._M_p._4_4_,(int)local_28._M_dataplus._M_p) !=
        &local_28.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_28._M_dataplus._M_p._4_4_,(int)local_28._M_dataplus._M_p));
    }
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  fmt::v5::file::~file(&local_4c);
  return;
}

Assistant:

TEST(FileTest, MoveFromTemporaryInAssignmentClosesFile) {
  int fd = 0xdead;
  file f = open_file();
  int old_fd = f.descriptor();
  f = OpenBufferedFile(fd);
  EXPECT_TRUE(isclosed(old_fd));
}